

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uchar sizedesc [8];
  
  uVar2 = hash->bytes;
  if (uVar2 >> 0x3d == 0) {
    sizedesc[3] = (uchar)(uVar2 >> 0x1d);
    sizedesc[2] = (uchar)(uVar2 >> 0x25);
    sizedesc[1] = (uchar)(uVar2 >> 0x2d);
    sizedesc[0] = (uchar)(uVar2 >> 0x35);
    sizedesc[7] = (char)uVar2 * '\b';
    sizedesc[6] = (uchar)(uVar2 >> 5);
    sizedesc[5] = (uchar)(uVar2 >> 0xd);
    sizedesc[4] = (uchar)(uVar2 >> 0x15);
    secp256k1_sha256_write
              (hash,secp256k1_sha256_finalize::pad,(ulong)(0x37U - (int)uVar2 & 0x3f) + 1);
    secp256k1_sha256_write(hash,sizedesc,8);
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      uVar1 = hash->s[lVar3];
      *(uint *)(out32 + lVar3 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      hash->s[lVar3] = 0;
    }
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/hash_impl.h"
          ,0x96,"test condition failed: hash->bytes < ((uint64_t)1 << 61)");
  abort();
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    int i;
    /* The maximum message size of SHA256 is 2^64-1 bits. */
    VERIFY_CHECK(hash->bytes < ((uint64_t)1 << 61));
    secp256k1_write_be32(&sizedesc[0], hash->bytes >> 29);
    secp256k1_write_be32(&sizedesc[4], hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, sizedesc, 8);
    for (i = 0; i < 8; i++) {
        secp256k1_write_be32(&out32[4*i], hash->s[i]);
        hash->s[i] = 0;
    }
}